

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPDistScheduleClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPDistScheduleClause *this)

{
  bool bVar1;
  string clause_string;
  allocator<char> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"dist_schedule ",local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"(",(allocator<char> *)&local_40);
  if (this->dist_schedule_kind == OMPC_DIST_SCHEDULE_KIND_static) {
    std::__cxx11::string::append((char *)local_60);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&this->chunk_size);
  bVar1 = std::operator!=(&local_40,"");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::append((char *)local_60);
    std::__cxx11::string::string((string *)&local_40,(string *)&this->chunk_size);
    std::__cxx11::string::append((string *)local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::append((char *)local_60);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDistScheduleClause::toString() {

    std::string result = "dist_schedule ";
    std::string clause_string = "(";
    OpenMPDistScheduleClauseKind kind = this->getKind();
    switch (kind) {
        case OMPC_DIST_SCHEDULE_KIND_static:
            clause_string += "static";
            break;
        default:
            ;
    }
    if (this->getChunkSize() != "") {
        clause_string += ", ";
    clause_string += this->getChunkSize();}
    clause_string += ") ";
    result += clause_string;
    return result;
}